

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O1

unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> __thiscall
duckdb::LogManager::CreateLogger
          (LogManager *this,LoggingContext context,bool thread_safe,bool mutable_settings)

{
  RegisteredLoggingContext context_p;
  RegisteredLoggingContext context_p_00;
  element_type *this_00;
  char in_CL;
  undefined7 in_register_00000031;
  LogManager *this_01;
  unique_lock<std::mutex> lck;
  RegisteredLoggingContext registered_logging_context;
  unique_lock<std::mutex> local_60;
  RegisteredLoggingContext local_50;
  
  this_01 = (LogManager *)CONCAT71(in_register_00000031,thread_safe);
  local_60._M_device = &this_01->lock;
  local_60._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  RegisterLoggingContextInternal(&local_50,this_01,&context);
  if (in_CL == '\0') {
    if ((this_01->config).enabled == false) {
      this_00 = (element_type *)operator_new(0x10);
      ((Logger *)&this_00->super_enable_shared_from_this<duckdb::LogManager>)->manager = this_01;
      ((Logger *)&this_00->super_enable_shared_from_this<duckdb::LogManager>)->_vptr_Logger =
           (_func_int **)&PTR__Logger_0199f3a0;
    }
    else {
      this_00 = (element_type *)operator_new(0x100);
      context_p_00.context.scope = local_50.context.scope;
      context_p_00.context._1_7_ = local_50.context._1_7_;
      context_p_00.context_id = local_50.context_id;
      context_p_00.context.thread_id.index = local_50.context.thread_id.index;
      context_p_00.context.connection_id.index = local_50.context.connection_id.index;
      context_p_00.context.transaction_id.index = local_50.context.transaction_id.index;
      context_p_00.context.query_id.index = local_50.context.query_id.index;
      ThreadSafeLogger::ThreadSafeLogger
                ((ThreadSafeLogger *)this_00,&this_01->config,context_p_00,this_01);
    }
  }
  else {
    this_00 = (element_type *)operator_new(0x108);
    context_p.context.scope = local_50.context.scope;
    context_p.context._1_7_ = local_50.context._1_7_;
    context_p.context_id = local_50.context_id;
    context_p.context.thread_id.index = local_50.context.thread_id.index;
    context_p.context.connection_id.index = local_50.context.connection_id.index;
    context_p.context.transaction_id.index = local_50.context.transaction_id.index;
    context_p.context.query_id.index = local_50.context.query_id.index;
    MutableLogger::MutableLogger((MutableLogger *)this_00,&this_01->config,context_p,this_01);
  }
  (this->super_enable_shared_from_this<duckdb::LogManager>).__weak_this_.internal.
  super___weak_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
  return (unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>)
         (unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>)this;
}

Assistant:

unique_ptr<Logger> LogManager::CreateLogger(LoggingContext context, bool thread_safe, bool mutable_settings) {
	unique_lock<mutex> lck(lock);

	auto registered_logging_context = RegisterLoggingContextInternal(context);

	if (mutable_settings) {
		return make_uniq<MutableLogger>(config, registered_logging_context, *this);
	}
	if (!config.enabled) {
		return make_uniq<NopLogger>(*this);
	}
	if (!thread_safe) {
		// TODO: implement ThreadLocalLogger and return it here
	}
	return make_uniq<ThreadSafeLogger>(config, registered_logging_context, *this);
}